

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::reserve(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  size_t sVar8;
  long lVar9;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar7;
  
  if (this->nAlloc < n) {
    if (n * 0x18 == 0) {
      poVar7 = (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x0;
    }
    else {
      pmVar3 = (this->alloc).memoryResource;
      iVar6 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n * 0x18,8);
      poVar7 = (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)
               CONCAT44(extraout_var,iVar6);
    }
    sVar8 = this->nStored;
    if (sVar8 != 0) {
      poVar4 = this->ptr;
      lVar9 = 0;
      do {
        (&poVar7->set)[lVar9] = (&poVar4->set)[lVar9];
        if ((&poVar4->set)[lVar9] == true) {
          *(undefined8 *)((long)&poVar7->optionalValue + lVar9) = 0;
          puVar1 = (undefined8 *)((long)&poVar4->optionalValue + lVar9);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&poVar7->optionalValue + lVar9);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          (&poVar4->set)[lVar9] = false;
        }
        if ((&poVar4->set)[lVar9] == true) {
          (&poVar4->set)[lVar9] = false;
        }
        lVar9 = lVar9 + 0x18;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
    if (this->ptr != (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x0) {
      pmVar3 = (this->alloc).memoryResource;
      (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc * 0x18,8);
    }
    this->nAlloc = n;
    this->ptr = poVar7;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }